

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::do_statement::do_statement
          (do_statement *this,source_extend *extend,expression_ptr *cond,statement_ptr *s)

{
  bool bVar1;
  statement_ptr *s_local;
  expression_ptr *cond_local;
  source_extend *extend_local;
  do_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__do_statement_0029b5d8;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->cond_,cond);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr(&this->s_,s);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->cond_);
  if (!bVar1) {
    __assert_fail("cond_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x280,
                  "mjs::do_statement::do_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->s_);
  if (!bVar1) {
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x281,
                  "mjs::do_statement::do_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit do_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& s) : statement(extend), cond_(std::move(cond)), s_(std::move(s)) {
        assert(cond_);
        assert(s_);
    }